

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlParseChunk(htmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar **ppxVar1;
  int *piVar2;
  byte bVar3;
  xmlParserInputState xVar4;
  xmlParserInputPtr pxVar5;
  xmlParserInputBufferPtr input;
  setDocumentLocatorSAXFunc p_Var6;
  void *pvVar7;
  xmlChar *pxVar8;
  __int32_t *p_Var9;
  endElementSAXFunc p_Var10;
  endDocumentSAXFunc p_Var11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  byte *pbVar16;
  xmlSAXLocator *pxVar17;
  htmlElemDesc *phVar18;
  __int32_t **pp_Var19;
  _xmlSAXHandler *p_Var20;
  charactersSAXFunc p_Var21;
  xmlDtdPtr pxVar22;
  xmlChar xVar23;
  xmlChar *pxVar24;
  char *pcVar25;
  xmlParserErrors error;
  undefined8 in_R8;
  xmlChar *pxVar26;
  byte bVar27;
  bool bVar28;
  bool bVar29;
  ushort local_5a;
  htmlParserNodeInfo node_info;
  
  if ((ctxt != (htmlParserCtxtPtr)0x0) && (pxVar5 = ctxt->input, pxVar5 != (xmlParserInputPtr)0x0))
  {
    if (((chunk == (char *)0x0 || size < 1) || (pxVar5->buf == (xmlParserInputBufferPtr)0x0)) ||
       (ctxt->instate == XML_PARSER_EOF)) {
      if (((ctxt->instate != XML_PARSER_EOF) &&
          (input = pxVar5->buf, input != (xmlParserInputBufferPtr)0x0)) &&
         ((input->encoder != (xmlCharEncodingHandlerPtr)0x0 &&
          ((input->buffer != (xmlBufPtr)0x0 && (input->raw != (xmlBufPtr)0x0)))))) {
        sVar15 = xmlBufGetInputBase(input->buffer,pxVar5);
        pxVar26 = ctxt->input->cur;
        pxVar24 = ctxt->input->base;
        iVar13 = xmlCharEncInput(input,terminate);
        xmlBufSetInputBaseCur(input->buffer,ctxt->input,sVar15,(long)pxVar26 - (long)pxVar24);
        if (iVar13 < 0) {
          pcVar25 = "encoder error\n";
          error = XML_ERR_INVALID_ENCODING;
          goto LAB_0014bef5;
        }
      }
    }
    else {
      sVar15 = xmlBufGetInputBase(pxVar5->buf->buffer,pxVar5);
      pxVar5 = ctxt->input;
      pxVar26 = pxVar5->cur;
      pxVar24 = pxVar5->base;
      iVar13 = xmlParserInputBufferPush(pxVar5->buf,size,chunk);
      xmlBufSetInputBaseCur
                (ctxt->input->buf->buffer,ctxt->input,sVar15,(long)pxVar26 - (long)pxVar24);
      if (iVar13 < 0) {
        ctxt->errNo = -1;
        ctxt->disableSAX = 1;
        return -1;
      }
    }
    bVar28 = terminate != 0;
    pxVar26 = (xmlChar *)0x0;
switchD_0014bfe8_default:
    while( true ) {
      pxVar5 = ctxt->input;
      if (pxVar5 == (xmlParserInputPtr)0x0) goto LAB_0014cbff;
      if (pxVar5->buf == (xmlParserInputBufferPtr)0x0) {
        sVar15 = (size_t)pxVar5->length;
      }
      else {
        sVar15 = xmlBufUse(pxVar5->buf->buffer);
      }
      pxVar24 = pxVar5->base;
      pbVar16 = pxVar5->cur;
      pxVar26 = pxVar24 + (sVar15 - (long)pbVar16);
      if ((terminate != 0) && (pxVar26 == (xmlChar *)0x0)) break;
      if ((long)pxVar26 < 1) goto LAB_0014cbff;
      bVar27 = *pbVar16;
      if (bVar27 != 0) goto code_r0x0014bfd4;
      pxVar5 = ctxt->input;
      ppxVar1 = &pxVar5->cur;
      *ppxVar1 = *ppxVar1 + 1;
      piVar2 = &pxVar5->col;
      *piVar2 = *piVar2 + 1;
    }
    htmlAutoCloseOnEnd(ctxt);
    bVar29 = true;
    if ((ctxt->nameNr == 0) && (ctxt->instate != XML_PARSER_EOF)) {
      ctxt->instate = XML_PARSER_EOF;
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var11 = ctxt->sax->endDocument, p_Var11 != (endDocumentSAXFunc)0x0)) {
        (*p_Var11)(ctxt->userData);
      }
    }
    goto LAB_0014cc20;
  }
  error = XML_ERR_INTERNAL_ERROR;
  pcVar25 = "htmlParseChunk: context error\n";
LAB_0014bef5:
  htmlParseErr(ctxt,error,pcVar25,(xmlChar *)0x0,(xmlChar *)0x0);
  return error;
code_r0x0014bfd4:
  switch(ctxt->instate) {
  case XML_PARSER_START:
    if ((bVar27 < 0x21) && ((0x100002600U >> ((ulong)bVar27 & 0x3f) & 1) != 0)) {
      htmlSkipBlankChars(ctxt);
      if (pxVar5->buf == (xmlParserInputBufferPtr)0x0) {
        sVar15 = (size_t)pxVar5->length;
      }
      else {
        sVar15 = xmlBufUse(pxVar5->buf->buffer);
      }
      pxVar26 = pxVar5->base + (sVar15 - (long)pxVar5->cur);
    }
    p_Var20 = ctxt->sax;
    if (p_Var20 != (_xmlSAXHandler *)0x0) {
      p_Var6 = p_Var20->setDocumentLocator;
      if (p_Var6 != (setDocumentLocatorSAXFunc)0x0) {
        pvVar7 = ctxt->userData;
        pxVar17 = __xmlDefaultSAXLocator();
        (*p_Var6)(pvVar7,pxVar17);
        p_Var20 = ctxt->sax;
        if (p_Var20 == (_xmlSAXHandler *)0x0) goto LAB_0014c564;
      }
      if ((p_Var20->startDocument != (startDocumentSAXFunc)0x0) && (ctxt->disableSAX == 0)) {
        (*p_Var20->startDocument)(ctxt->userData);
      }
    }
LAB_0014c564:
    if ((*pxVar5->cur != '<') || (pxVar5->cur[1] != '!')) {
LAB_0014c60a:
      ctxt->instate = XML_PARSER_MISC;
      goto switchD_0014bfe8_default;
    }
    pp_Var19 = __ctype_toupper_loc();
    p_Var9 = *pp_Var19;
    pxVar24 = ctxt->input->cur;
    if (((p_Var9[pxVar24[2]] != 0x44) ||
        (((p_Var9[pxVar24[3]] != 0x4f || (p_Var9[pxVar24[4]] != 0x43)) ||
         (p_Var9[pxVar24[5]] != 0x54)))) ||
       (((p_Var9[pxVar24[6]] != 0x59 || (p_Var9[pxVar24[7]] != 0x50)) ||
        (p_Var9[pxVar24[8]] != 0x45)))) goto LAB_0014c60a;
    goto joined_r0x0014c4e7;
  case XML_PARSER_MISC:
    htmlSkipBlankChars(ctxt);
    if (pxVar5->buf == (xmlParserInputBufferPtr)0x0) {
      sVar15 = (size_t)pxVar5->length;
    }
    else {
      sVar15 = xmlBufUse(pxVar5->buf->buffer);
    }
    pxVar24 = pxVar5->cur;
    pxVar26 = pxVar5->base + (sVar15 - (long)pxVar24);
    if ((long)pxVar26 < 1) goto LAB_0014cbff;
    if (pxVar26 == (xmlChar *)0x1) {
      xVar23 = ' ';
      if (terminate == 0) goto LAB_0014cd80;
    }
    else {
      xVar23 = pxVar24[1];
    }
    if (xVar23 != '!' || *pxVar24 != '<') {
      if (xVar23 != '?' || *pxVar24 != '<') goto LAB_0014c4fc;
      if ((terminate != 0) ||
         (iVar13 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar13)) {
        htmlParsePI(ctxt);
        ctxt->instate = XML_PARSER_MISC;
        goto switchD_0014bfe8_default;
      }
      goto LAB_0014cd80;
    }
    if ((pxVar24[2] == '-') && (pxVar24[3] == '-')) {
      if ((terminate != 0) || (iVar13 = htmlParseLookupCommentEnd(ctxt), -1 < iVar13)) {
        htmlParseComment(ctxt);
        ctxt->instate = XML_PARSER_MISC;
        goto switchD_0014bfe8_default;
      }
      goto LAB_0014cd80;
    }
    pp_Var19 = __ctype_toupper_loc();
    p_Var9 = *pp_Var19;
    pxVar24 = ctxt->input->cur;
    if ((((p_Var9[pxVar24[2]] != 0x44) || (p_Var9[pxVar24[3]] != 0x4f)) ||
        (p_Var9[pxVar24[4]] != 0x43)) ||
       (((p_Var9[pxVar24[5]] != 0x54 || (p_Var9[pxVar24[6]] != 0x59)) ||
        ((p_Var9[pxVar24[7]] != 0x50 || (p_Var9[pxVar24[8]] != 0x45)))))) {
      if (pxVar26 <= &DAT_00000008) goto switchD_0014bfe8_caseD_ffffffff;
      goto LAB_0014c4fc;
    }
joined_r0x0014c4e7:
    if ((terminate != 0) ||
       (iVar13 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8), -1 < iVar13)) {
      htmlParseDocTypeDecl(ctxt);
      ctxt->instate = XML_PARSER_PROLOG;
      goto switchD_0014bfe8_default;
    }
LAB_0014cd80:
    bVar28 = false;
    goto switchD_0014bfe8_caseD_ffffffff;
  case XML_PARSER_PI:
    pcVar25 = "HPP: internal error, state == PI\n";
    break;
  case XML_PARSER_DTD:
    pcVar25 = "HPP: internal error, state == DTD\n";
    break;
  case XML_PARSER_PROLOG:
    htmlSkipBlankChars(ctxt);
    if (pxVar5->buf == (xmlParserInputBufferPtr)0x0) {
      sVar15 = (size_t)pxVar5->length;
    }
    else {
      sVar15 = xmlBufUse(pxVar5->buf->buffer);
    }
    pbVar16 = pxVar5->cur;
    pxVar26 = pxVar5->base + (sVar15 - (long)pbVar16);
    if (1 < (long)pxVar26) {
      if (pbVar16[1] == 0x21 && (*pbVar16 ^ 0x3c) == 0) {
        if ((pbVar16[2] != 0x2d) || (pbVar16[3] != 0x2d)) {
          if (pxVar26 < &DAT_00000004) goto switchD_0014bfe8_caseD_ffffffff;
          goto LAB_0014c4fc;
        }
        if ((terminate != 0) || (iVar13 = htmlParseLookupCommentEnd(ctxt), -1 < iVar13)) {
          htmlParseComment(ctxt);
          ctxt->instate = XML_PARSER_PROLOG;
          goto switchD_0014bfe8_default;
        }
      }
      else {
        if ((*pbVar16 ^ 0x3c) != 0 || pbVar16[1] != 0x3f) goto LAB_0014c4fc;
        if ((terminate != 0) ||
           (iVar13 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar13)) {
          htmlParsePI(ctxt);
          ctxt->instate = XML_PARSER_PROLOG;
          goto switchD_0014bfe8_default;
        }
      }
      goto LAB_0014cd80;
    }
    goto LAB_0014cbff;
  case XML_PARSER_COMMENT:
    pcVar25 = "HPP: internal error, state == COMMENT\n";
    break;
  case XML_PARSER_START_TAG:
    if (pxVar26 == (xmlChar *)0x1) {
      if (terminate == 0) goto LAB_0014cd80;
      if (bVar27 != 0x3c) goto LAB_0014c4fc;
    }
    else {
      if (bVar27 != 0x3c) goto LAB_0014c4fc;
      if (pbVar16[1] == 0x2f) {
        ctxt->instate = XML_PARSER_END_TAG;
        ctxt->checkIndex = 0;
        goto switchD_0014bfe8_default;
      }
      if ((terminate == 0) &&
         (iVar13 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8), iVar13 < 0))
      goto LAB_0014cd80;
    }
    if (ctxt->record_info != 0) {
      pxVar5 = ctxt->input;
      node_info.begin_pos = (unsigned_long)(pxVar5->cur + (pxVar5->consumed - (long)pxVar5->base));
      node_info.begin_line = (unsigned_long)pxVar5->line;
    }
    iVar13 = htmlParseStartTag(ctxt);
    pxVar24 = ctxt->name;
    if (pxVar24 == (xmlChar *)0x0 || iVar13 == -1) {
      if (*ctxt->input->cur == '>') {
        xmlNextChar(ctxt);
      }
      goto switchD_0014bfe8_default;
    }
    phVar18 = htmlTagLookup(pxVar24);
    if (phVar18 == (htmlElemDesc *)0x0) {
      in_R8 = 0;
      htmlParseErr(ctxt,XML_HTML_UNKNOWN_TAG,"Tag %s invalid\n",pxVar24,(xmlChar *)0x0);
    }
    pxVar5 = ctxt->input;
    pxVar8 = pxVar5->cur;
    if (*pxVar8 == '>') {
      xmlNextChar(ctxt);
      if ((phVar18 != (htmlElemDesc *)0x0) && (phVar18->empty != '\0')) {
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           (p_Var10 = ctxt->sax->endElement, p_Var10 != (endElementSAXFunc)0x0)) {
          (*p_Var10)(ctxt->userData,pxVar24);
        }
        htmlnamePop(ctxt);
      }
      if (ctxt->record_info != 0) {
        htmlNodeInfoPush(ctxt,&node_info);
      }
    }
    else {
      if ((*pxVar8 != '/') || (pxVar8[1] != '>')) {
        in_R8 = 0;
        htmlParseErr(ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s\n",pxVar24,
                     (xmlChar *)0x0);
        iVar13 = xmlStrEqual(pxVar24,ctxt->name);
        if (iVar13 != 0) {
          nodePop(ctxt);
          htmlnamePop(ctxt);
        }
        if (ctxt->record_info != 0) {
          htmlNodeInfoPush(ctxt,&node_info);
        }
LAB_0014c4fc:
        ctxt->instate = XML_PARSER_CONTENT;
        goto switchD_0014bfe8_default;
      }
      pxVar5->cur = pxVar8 + 2;
      pxVar5->col = pxVar5->col + 2;
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var10 = ctxt->sax->endElement, p_Var10 != (endElementSAXFunc)0x0)) {
        (*p_Var10)(ctxt->userData,pxVar24);
      }
      htmlnamePop(ctxt);
    }
    ctxt->instate = XML_PARSER_CONTENT;
    goto switchD_0014bfe8_default;
  case XML_PARSER_CONTENT:
    local_5a = 0;
    if (ctxt->token != 0) {
      local_5a = (ushort)(byte)ctxt->token;
      htmlCheckParagraph(ctxt);
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var21 = ctxt->sax->characters, p_Var21 != (charactersSAXFunc)0x0)) {
        (*p_Var21)(ctxt->userData,(xmlChar *)&local_5a,1);
      }
      ctxt->token = 0;
      ctxt->checkIndex = 0;
    }
    if ((terminate == 0) || (pxVar26 != (xmlChar *)0x1)) {
      if (pxVar26 == (xmlChar *)0x1) goto switchD_0014bfe8_caseD_ffffffff;
      bVar27 = *pxVar5->cur;
      bVar3 = pxVar5->cur[1];
      iVar13 = xmlStrEqual(ctxt->name,"script");
      if ((iVar13 == 0) && (iVar13 = xmlStrEqual(ctxt->name,"style"), iVar13 == 0)) {
        bVar12 = bVar27 ^ 0x3c;
        if (bVar3 == 0x21 && bVar12 == 0) {
          pp_Var19 = __ctype_toupper_loc();
          p_Var9 = *pp_Var19;
          pxVar24 = ctxt->input->cur;
          if ((((((p_Var9[pxVar24[2]] == 0x44) && (p_Var9[pxVar24[3]] == 0x4f)) &&
                (p_Var9[pxVar24[4]] == 0x43)) &&
               ((p_Var9[pxVar24[5]] == 0x54 && (p_Var9[pxVar24[6]] == 0x59)))) &&
              (p_Var9[pxVar24[7]] == 0x50)) && (p_Var9[pxVar24[8]] == 0x45)) {
            if ((terminate == 0) &&
               (iVar13 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8), iVar13 < 0))
            goto switchD_0014bfe8_caseD_ffffffff;
            in_R8 = 0;
            htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"Misplaced DOCTYPE declaration\n",
                         (xmlChar *)"DOCTYPE",(xmlChar *)0x0);
            htmlParseDocTypeDecl(ctxt);
            goto switchD_0014bfe8_default;
          }
          if ((pxVar5->cur[2] != '-') || (pxVar5->cur[3] != '-')) {
            if (pxVar26 < &DAT_00000004) goto switchD_0014bfe8_caseD_ffffffff;
LAB_0014cad7:
            in_R8 = 0;
            htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseTryOrFinish: invalid element name\n",
                         (xmlChar *)0x0,(xmlChar *)0x0);
            htmlCheckParagraph(ctxt);
            if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
               (p_Var21 = ctxt->sax->characters, p_Var21 != (charactersSAXFunc)0x0)) {
              (*p_Var21)(ctxt->userData,pxVar5->cur,1);
            }
            xmlNextChar(ctxt);
            goto switchD_0014bfe8_default;
          }
          if ((terminate == 0) && (iVar13 = htmlParseLookupCommentEnd(ctxt), iVar13 < 0))
          goto switchD_0014bfe8_caseD_ffffffff;
          htmlParseComment(ctxt);
        }
        else {
          if (bVar3 != 0x3f || bVar12 != 0) {
            if (bVar12 == 0 && bVar3 == 0x2f) {
              ctxt->instate = XML_PARSER_END_TAG;
            }
            else {
              if (bVar27 != 0x3c) {
                if ((terminate == 0) &&
                   (iVar13 = htmlParseLookupSequence(ctxt,'<','\0','\0',(int)in_R8), iVar13 < 0))
                goto switchD_0014bfe8_caseD_ffffffff;
                ctxt->checkIndex = 0;
                while ((bVar27 != 0x3c && (pxVar5->cur < pxVar5->end))) {
                  if (bVar27 == 0x26) {
                    htmlParseReference(ctxt);
                  }
                  else {
                    htmlParseCharData(ctxt);
                  }
                  bVar27 = *pxVar5->cur;
                }
                goto switchD_0014bfe8_default;
              }
              if ((terminate == 0) && (bVar3 == 0)) goto switchD_0014bfe8_caseD_ffffffff;
              if ((0x19 < (byte)((bVar3 & 0xdf) + 0xbf)) &&
                 ((0x31 < bVar3 - 0x2e ||
                  ((0x2000000001001U >> ((ulong)(bVar3 - 0x2e) & 0x3f) & 1) == 0))))
              goto LAB_0014cad7;
              ctxt->instate = XML_PARSER_START_TAG;
            }
            ctxt->checkIndex = 0;
            goto switchD_0014bfe8_default;
          }
          if ((terminate == 0) &&
             (iVar13 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), iVar13 < 0))
          goto switchD_0014bfe8_caseD_ffffffff;
          htmlParsePI(ctxt);
        }
        ctxt->instate = XML_PARSER_CONTENT;
        goto switchD_0014bfe8_default;
      }
      if (terminate == 0) {
        uVar14 = htmlParseLookupSequence(ctxt,'<','/','\0',(int)in_R8);
        if ((int)uVar14 < 0) goto switchD_0014bfe8_caseD_ffffffff;
        if (pxVar5->cur[(ulong)uVar14 + 2] == '\0') goto LAB_0014cd80;
      }
      htmlParseScript(ctxt);
      if (bVar3 == 0x2f && bVar27 == 0x3c) {
        ctxt->instate = XML_PARSER_END_TAG;
        ctxt->checkIndex = 0;
      }
      goto switchD_0014bfe8_default;
    }
    bVar27 = *pxVar5->cur;
    if ((bVar27 == 0x26) || (bVar27 == 0x3c)) goto switchD_0014bfe8_caseD_ffffffff;
    p_Var20 = ctxt->sax;
    if (p_Var20 == (_xmlSAXHandler *)0x0) goto LAB_0014c9fe;
    local_5a = CONCAT11(local_5a._1_1_,bVar27);
    if ((bVar27 < 0x21) && ((0x100002600U >> ((ulong)(uint)bVar27 & 0x3f) & 1) != 0)) {
      if (ctxt->keepBlanks != 0) goto LAB_0014c9e4;
      p_Var21 = p_Var20->ignorableWhitespace;
    }
    else {
      htmlCheckParagraph(ctxt);
      p_Var20 = ctxt->sax;
LAB_0014c9e4:
      p_Var21 = p_Var20->characters;
    }
    if (p_Var21 != (charactersSAXFunc)0x0) {
      (*p_Var21)(ctxt->userData,(xmlChar *)&local_5a,1);
    }
LAB_0014c9fe:
    ctxt->token = 0;
    ctxt->checkIndex = 0;
    pxVar5->cur = pxVar5->cur + 1;
    goto switchD_0014bfe8_default;
  case XML_PARSER_CDATA_SECTION:
    pcVar25 = "HPP: internal error, state == CDATA\n";
    break;
  case XML_PARSER_END_TAG:
    if (pxVar26 == (xmlChar *)0x1) goto switchD_0014bfe8_caseD_ffffffff;
    if ((terminate != 0) ||
       (iVar13 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar13)) {
      htmlParseEndTag(ctxt);
      xVar4 = XML_PARSER_CONTENT;
      if (ctxt->nameNr == 0) {
        xVar4 = XML_PARSER_EPILOG;
      }
      ctxt->instate = xVar4;
      ctxt->checkIndex = 0;
      goto switchD_0014bfe8_default;
    }
    goto LAB_0014cd80;
  case XML_PARSER_ENTITY_DECL:
    pcVar25 = "HPP: internal error, state == ENTITY_DECL\n";
    break;
  case XML_PARSER_ENTITY_VALUE:
    pcVar25 = "HPP: internal error, state == ENTITY_VALUE\n";
    break;
  case XML_PARSER_ATTRIBUTE_VALUE:
    in_R8 = 0;
    htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"HPP: internal error, state == ATTRIBUTE_VALUE\n",
                 (xmlChar *)0x0,(xmlChar *)0x0);
    ctxt->instate = XML_PARSER_START_TAG;
    ctxt->checkIndex = 0;
    goto switchD_0014bfe8_default;
  case XML_PARSER_SYSTEM_LITERAL:
    pcVar25 = "HPP: internal error, state == XML_PARSER_SYSTEM_LITERAL\n";
    break;
  case XML_PARSER_EPILOG:
    if (pxVar5->buf == (xmlParserInputBufferPtr)0x0) {
      sVar15 = (size_t)pxVar5->length;
    }
    else {
      sVar15 = xmlBufUse(pxVar5->buf->buffer);
      pxVar24 = pxVar5->base;
      pbVar16 = pxVar5->cur;
    }
    pxVar26 = pxVar24 + (sVar15 - (long)pbVar16);
    if (0 < (long)pxVar26) {
      bVar27 = *pbVar16;
      if (((ulong)bVar27 < 0x21) && ((0x100002600U >> ((ulong)bVar27 & 0x3f) & 1) != 0)) {
        htmlParseCharData(ctxt);
        goto switchD_0014bfe8_caseD_ffffffff;
      }
      if (pxVar26 == (xmlChar *)0x1) goto switchD_0014bfe8_caseD_ffffffff;
      if (pbVar16[1] == 0x21 && bVar27 == 0x3c) {
        if ((pbVar16[2] == 0x2d) && (pbVar16[3] == 0x2d)) {
          if ((terminate != 0) || (iVar13 = htmlParseLookupCommentEnd(ctxt), -1 < iVar13)) {
            htmlParseComment(ctxt);
            ctxt->instate = XML_PARSER_EPILOG;
            goto switchD_0014bfe8_default;
          }
          goto LAB_0014cd80;
        }
        if (pxVar26 < &DAT_00000004) goto switchD_0014bfe8_caseD_ffffffff;
      }
      else if ((bVar27 == 0x3c) && (pbVar16[1] == 0x3f)) {
        if ((terminate != 0) ||
           (iVar13 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar13)) {
          htmlParsePI(ctxt);
          ctxt->instate = XML_PARSER_EPILOG;
          goto switchD_0014bfe8_default;
        }
        goto LAB_0014cd80;
      }
      ctxt->errNo = 5;
      ctxt->wellFormed = 0;
      goto LAB_0014cd01;
    }
LAB_0014cbff:
    bVar29 = pxVar26 == (xmlChar *)0x0;
LAB_0014cc20:
    if ((terminate == 0) || (!bVar29)) goto switchD_0014bfe8_caseD_ffffffff;
    htmlAutoCloseOnEnd(ctxt);
    bVar28 = true;
    if ((ctxt->nameNr != 0) || (ctxt->instate == XML_PARSER_EOF))
    goto switchD_0014bfe8_caseD_ffffffff;
LAB_0014cd01:
    ctxt->instate = XML_PARSER_EOF;
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var11 = ctxt->sax->endDocument, p_Var11 != (endDocumentSAXFunc)0x0)) {
      (*p_Var11)(ctxt->userData);
    }
    goto switchD_0014bfe8_caseD_ffffffff;
  case XML_PARSER_IGNORE:
    pcVar25 = "HPP: internal error, state == XML_PARSER_IGNORE\n";
    break;
  case XML_PARSER_PUBLIC_LITERAL:
    pcVar25 = "HPP: internal error, state == XML_PARSER_LITERAL\n";
    break;
  case XML_PARSER_EOF:
    goto switchD_0014bfe8_caseD_ffffffff;
  default:
    goto switchD_0014bfe8_default;
  }
  in_R8 = 0;
  htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,pcVar25,(xmlChar *)0x0,(xmlChar *)0x0);
  ctxt->instate = XML_PARSER_CONTENT;
  ctxt->checkIndex = 0;
  goto switchD_0014bfe8_default;
switchD_0014bfe8_caseD_ffffffff:
  if (((((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) &&
      ((bVar28 || ((ctxt->instate == XML_PARSER_EPILOG || (ctxt->instate == XML_PARSER_EOF)))))) &&
     (pxVar22 = xmlGetIntSubset(ctxt->myDoc), pxVar22 == (xmlDtdPtr)0x0)) {
    pxVar22 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                 (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                 (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
    ctxt->myDoc->intSubset = pxVar22;
  }
  if (terminate != 0) {
    xVar4 = ctxt->instate;
    if (xVar4 != XML_PARSER_EOF) {
      if ((xVar4 != XML_PARSER_MISC) && (xVar4 != XML_PARSER_EPILOG)) {
        ctxt->errNo = 5;
        ctxt->wellFormed = 0;
      }
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var11 = ctxt->sax->endDocument, p_Var11 != (endDocumentSAXFunc)0x0)) {
        (*p_Var11)(ctxt->userData);
      }
    }
    ctxt->instate = XML_PARSER_EOF;
  }
  return ctxt->errNo;
}

Assistant:

int
htmlParseChunk(htmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseChunk: context error\n", NULL, NULL);
	return(XML_ERR_INTERNAL_ERROR);
    }
    if ((size > 0) && (chunk != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->instate != XML_PARSER_EOF))  {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
	size_t cur = ctxt->input->cur - ctxt->input->base;
	int res;

	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
	if (res < 0) {
	    ctxt->errNo = XML_PARSER_EOF;
	    ctxt->disableSAX = 1;
	    return (XML_PARSER_EOF);
	}
#ifdef DEBUG_PUSH
	xmlGenericError(xmlGenericErrorContext, "HPP: pushed %d\n", size);
#endif

#if 0
	if ((terminate) || (ctxt->input->buf->buffer->use > 80))
	    htmlParseTryOrFinish(ctxt, terminate);
#endif
    } else if (ctxt->instate != XML_PARSER_EOF) {
	if ((ctxt->input != NULL) && ctxt->input->buf != NULL) {
	    xmlParserInputBufferPtr in = ctxt->input->buf;
	    if ((in->encoder != NULL) && (in->buffer != NULL) &&
		    (in->raw != NULL)) {
		int nbchars;
		size_t base = xmlBufGetInputBase(in->buffer, ctxt->input);
		size_t current = ctxt->input->cur - ctxt->input->base;

		nbchars = xmlCharEncInput(in, terminate);
		xmlBufSetInputBaseCur(in->buffer, ctxt->input, base, current);
		if (nbchars < 0) {
		    htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
			         "encoder error\n", NULL, NULL);
		    return(XML_ERR_INVALID_ENCODING);
		}
	    }
	}
    }
    htmlParseTryOrFinish(ctxt, terminate);
    if (terminate) {
	if ((ctxt->instate != XML_PARSER_EOF) &&
	    (ctxt->instate != XML_PARSER_EPILOG) &&
	    (ctxt->instate != XML_PARSER_MISC)) {
	    ctxt->errNo = XML_ERR_DOCUMENT_END;
	    ctxt->wellFormed = 0;
	}
	if (ctxt->instate != XML_PARSER_EOF) {
	    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
		ctxt->sax->endDocument(ctxt->userData);
	}
	ctxt->instate = XML_PARSER_EOF;
    }
    return((xmlParserErrors) ctxt->errNo);
}